

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::cleanup(HEkkPrimal *this,EVP_PKEY_CTX *ctx)

{
  HEkk *pHVar1;
  
  pHVar1 = this->ekk_instance_;
  if ((pHVar1->info_).bounds_perturbed == true) {
    highsLogDev(&(pHVar1->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "primal-cleanup-shift\n");
    HEkk::initialiseBound(this->ekk_instance_,kPrimal,this->solve_phase,false);
    HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
    (pHVar1->info_).allow_bound_perturbation = false;
    HEkk::computePrimal(this->ekk_instance_);
    HEkk::computeSimplexPrimalInfeasible(this->ekk_instance_);
    HEkk::computePrimalObjectiveValue(this->ekk_instance_);
    (pHVar1->info_).updated_primal_objective_value = (pHVar1->info_).primal_objective_value;
    HEkk::computeSimplexDualInfeasible(this->ekk_instance_);
    reportRebuild(this,-1);
    return;
  }
  return;
}

Assistant:

void HEkkPrimal::cleanup() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  if (!info.bounds_perturbed) return;
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "primal-cleanup-shift\n");
  // Remove perturbation and don't permit further perturbation
  ekk_instance_.initialiseBound(SimplexAlgorithm::kPrimal, solve_phase, false);
  ekk_instance_.initialiseNonbasicValueAndMove();
  info.allow_bound_perturbation = false;
  // Possibly take a copy of the original duals before recomputing them
  /*
  vector<double> original_baseValue;
  if (ekk_instance_.options_->highs_debug_level > kHighsDebugLevelCheap)
    original_baseValue = info.baseValue_;
  */
  // Compute the primal values
  ekk_instance_.computePrimal();
  // Possibly analyse the change in duals
  /*  debugCleanup(ekk_instance_, original_baseValue); */
  // Compute the primal infeasibilities
  ekk_instance_.computeSimplexPrimalInfeasible();

  // Compute the primal objective value
  ekk_instance_.computePrimalObjectiveValue();
  // Now that there's a new primal_objective_value, reset the updated
  // value
  info.updated_primal_objective_value = info.primal_objective_value;

  //  if (!info.run_quiet) {
  // Report the dual infeasibilities
  ekk_instance_.computeSimplexDualInfeasible();
  // In phase 1, report the simplex LP dual infeasibilities
  // In phase 2, report the simplex dual infeasibilities (known)
  //    if (solve_phase == kSolvePhase1)
  //    computeSimplexLpDualInfeasible(ekk_instance_);
  reportRebuild(kRebuildReasonCleanup);
  //  }
}